

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O3

void __thiscall
ktx::CommandExtract::decodeAndSaveASTC
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *compressedData,
          size_t compressedSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  astcenc_error aVar4;
  uchar *data;
  ulong __n;
  VkFormat vkFormat_00;
  uint uVar5;
  ASTCencStruct astcenc;
  string local_160;
  ulong local_140;
  astcenc_image local_138;
  uchar *bufferPtr;
  FormatDescriptor local_118;
  astcenc_config config;
  
  uVar2 = *(undefined8 *)&format->basic;
  uVar5 = (uint)((ulong)uVar2 >> 0x20);
  bVar3 = isFormatSRGB(vkFormat);
  config.tune_3partition_early_out_limit_factor = 0.0;
  config.tune_2plane_early_out_limit_correlation = 0.0;
  config.tune_search_mode0_enable = 0.0;
  config._108_4_ = 0;
  config.tune_4partitioning_candidate_limit = 0;
  config.tune_db_limit = 0.0;
  config.tune_mse_overshoot = 0.0;
  config.tune_2partition_early_out_limit_factor = 0.0;
  config.tune_refinement_limit = 0;
  config.tune_candidate_limit = 0;
  config.tune_2partitioning_candidate_limit = 0;
  config.tune_3partitioning_candidate_limit = 0;
  config.tune_2partition_index_limit = 0;
  config.tune_3partition_index_limit = 0;
  config.tune_4partition_index_limit = 0;
  config.tune_block_mode_limit = 0;
  config.cw_a_weight = 0.0;
  config.a_scale_radius = 0;
  config.rgbm_m_scale = 0.0;
  config.tune_partition_count_limit = 0;
  config.block_z = 0;
  config.cw_r_weight = 0.0;
  config.cw_g_weight = 0.0;
  config.cw_b_weight = 0.0;
  config.profile = ASTCENC_PRF_LDR_SRGB;
  config.flags = 0;
  config.block_x = 0;
  config.block_y = 0;
  config.progress_callback = (astcenc_progress_callback)0x0;
  aVar4 = astcenc_config_init((uint)!bVar3,(uVar5 & 0xff) + 1,(uVar5 >> 8 & 0xff) + 1,
                              ((ushort)((ulong)uVar2 >> 0x30) & 0xff) + 1,60.0,0x10,&config);
  if (aVar4 != ASTCENC_SUCCESS) {
    local_118.basic._0_8_ = astcenc_get_error_string(aVar4);
    Reporter::fatal<char_const(&)[34],char_const*>
              (&(this->super_Command).super_Reporter,DFD_FAILURE,
               (char (*) [34])"ASTC Codec config init failed: {}",(char **)&local_118);
  }
  astcenc.context = (astcenc_context *)0x0;
  aVar4 = astcenc_context_alloc(&config,1,&astcenc.context);
  if (aVar4 != ASTCENC_SUCCESS) {
    local_118.basic._0_8_ = astcenc_get_error_string(aVar4);
    Reporter::fatal<char_const(&)[36],char_const*>
              (&(this->super_Command).super_Reporter,DFD_FAILURE,
               (char (*) [36])"ASTC Codec context alloc failed: {}",(char **)&local_118);
  }
  local_138.dim_y = height;
  local_138.dim_z = 1;
  __n = (ulong)(width * height * 4);
  local_140 = (ulong)width;
  local_138.dim_x = width;
  data = (uchar *)operator_new__(__n);
  memset(data,0,__n);
  local_138.data = &bufferPtr;
  local_138.data_type = ASTCENC_TYPE_U8;
  bufferPtr = data;
  aVar4 = astcenc_decompress_image
                    (astcenc.context,(uchar *)compressedData,compressedSize,&local_138,
                     &decodeAndSaveASTC::swizzle,0);
  if (aVar4 != ASTCENC_SUCCESS) {
    local_118.basic._0_8_ = astcenc_get_error_string(aVar4);
    Reporter::fatal<char_const(&)[33],char_const*>
              (&(this->super_Command).super_Reporter,DFD_FAILURE,
               (char (*) [33])"ASTC Codec decompress failed: {}",(char **)&local_118);
  }
  astcenc_decompress_reset(astcenc.context);
  bVar3 = isFormatSRGB(vkFormat);
  vkFormat_00 = VK_FORMAT_R8G8B8A8_UNORM;
  if (bVar3) {
    vkFormat_00 = VK_FORMAT_R8G8B8A8_SRGB;
  }
  local_160._M_dataplus._M_p = (filepath->_M_dataplus)._M_p;
  paVar1 = &filepath->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == paVar1) {
    local_160.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_160.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_160._M_string_length = filepath->_M_string_length;
  (filepath->_M_dataplus)._M_p = (pointer)paVar1;
  filepath->_M_string_length = 0;
  (filepath->field_2)._M_local_buf[0] = '\0';
  createFormatDescriptor(&local_118,vkFormat_00,&(this->super_Command).super_Reporter);
  saveImageFile(this,&local_160,appendExtension,(char *)data,__n,vkFormat_00,&local_118,
                (uint32_t)local_140,height);
  if (local_118.samples.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.samples.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.samples.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.samples.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.extended.iccProfile.profile.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.extended.iccProfile.profile.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.extended.iccProfile.profile.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.extended.iccProfile.profile.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.extended.iccProfile.name._M_dataplus._M_p !=
      &local_118.extended.iccProfile.name.field_2) {
    operator_delete(local_118.extended.iccProfile.name._M_dataplus._M_p,
                    local_118.extended.iccProfile.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  operator_delete__(data);
  astcenc_context_free(astcenc.context);
  return;
}

Assistant:

void CommandExtract::decodeAndSaveASTC(std::string filepath, bool appendExtension, VkFormat vkFormat, const FormatDescriptor& format,
        uint32_t width, uint32_t height, const char* compressedData, std::size_t compressedSize) {

    const auto threadCount = 1u;
    const auto blockSizeX = format.basic.texelBlockDimension0 + 1u;
    const auto blockSizeY = format.basic.texelBlockDimension1 + 1u;
    const auto blockSizeZ = format.basic.texelBlockDimension2 + 1u;
    static constexpr astcenc_swizzle swizzle{ASTCENC_SWZ_R, ASTCENC_SWZ_G, ASTCENC_SWZ_B, ASTCENC_SWZ_A};

    astcenc_error ec = ASTCENC_SUCCESS;

    const astcenc_profile profile = isFormatSRGB(vkFormat) ? ASTCENC_PRF_LDR_SRGB : ASTCENC_PRF_LDR;
    astcenc_config config{};
    ec = astcenc_config_init(profile, blockSizeX, blockSizeY, blockSizeZ, ASTCENC_PRE_MEDIUM, ASTCENC_FLG_DECOMPRESS_ONLY, &config);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec config init failed: {}", astcenc_get_error_string(ec));

    struct ASTCencStruct {
        astcenc_context* context = nullptr;
        ~ASTCencStruct() {
            astcenc_context_free(context);
        }
    } astcenc;
    astcenc_context*& context = astcenc.context;

    ec = astcenc_context_alloc(&config, threadCount, &context);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec context alloc failed: {}", astcenc_get_error_string(ec));

    astcenc_image image{};
    image.dim_x = width;
    image.dim_y = height;
    image.dim_z = 1; // 3D ASTC formats are currently not supported
    const auto uncompressedSize = width * height * 4 * sizeof(uint8_t);
    const auto uncompressedBuffer = std::make_unique<uint8_t[]>(uncompressedSize);
    auto* bufferPtr = uncompressedBuffer.get();
    image.data = reinterpret_cast<void**>(&bufferPtr);
    image.data_type = ASTCENC_TYPE_U8;

    ec = astcenc_decompress_image(context, reinterpret_cast<const uint8_t*>(compressedData), compressedSize, &image, &swizzle, 0);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec decompress failed: {}", astcenc_get_error_string(ec));
    astcenc_decompress_reset(context);

    const auto uncompressedVkFormat = isFormatSRGB(vkFormat) ?
            VK_FORMAT_R8G8B8A8_SRGB :
            VK_FORMAT_R8G8B8A8_UNORM;
    saveImageFile(
            std::move(filepath),
            appendExtension,
            reinterpret_cast<const char*>(uncompressedBuffer.get()),
            uncompressedSize,
            uncompressedVkFormat,
            createFormatDescriptor(uncompressedVkFormat, *this),
            width,
            height);
}